

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

void __thiscall adios2::format::BPBase::DeleteBuffers(BPBase *this)

{
  BufferSTL *in_RDI;
  string *in_stack_00000088;
  allocator local_61;
  string local_60 [8];
  string *in_stack_ffffffffffffffa8;
  IOChrono *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"buffering",&local_29);
  profiling::IOChrono::Start((IOChrono *)this,in_stack_00000088);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  BufferSTL::Delete(in_RDI);
  BufferSTL::Delete(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"buffering",&local_61);
  profiling::IOChrono::Stop(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void BPBase::DeleteBuffers()
{
    m_Profiler.Start("buffering");
    m_Data.Delete();
    m_Metadata.Delete();
    m_Profiler.Stop("buffering");
}